

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList *
parserAddExprIdListTerm(Parse *pParse,ExprList *pPrior,Token *pIdToken,int hasCollate,int sortOrder)

{
  ExprList *pList;
  ExprList *p;
  int sortOrder_local;
  int hasCollate_local;
  Token *pIdToken_local;
  ExprList *pPrior_local;
  Parse *pParse_local;
  
  pList = sqlite3ExprListAppend(pParse,pPrior,(Expr *)0x0);
  if (((hasCollate != 0) || (sortOrder != -1)) && ((pParse->db->init).busy == '\0')) {
    sqlite3ErrorMsg(pParse,"syntax error after column name \"%.*s\"",(ulong)pIdToken->n,pIdToken->z)
    ;
  }
  sqlite3ExprListSetName(pParse,pList,pIdToken,1);
  return pList;
}

Assistant:

static ExprList *parserAddExprIdListTerm(
    Parse *pParse,
    ExprList *pPrior,
    Token *pIdToken,
    int hasCollate,
    int sortOrder
  ){
    ExprList *p = sqlite3ExprListAppend(pParse, pPrior, 0);
    if( (hasCollate || sortOrder!=SQLITE_SO_UNDEFINED)
        && pParse->db->init.busy==0
    ){
      sqlite3ErrorMsg(pParse, "syntax error after column name \"%.*s\"",
                         pIdToken->n, pIdToken->z);
    }
    sqlite3ExprListSetName(pParse, p, pIdToken, 1);
    return p;
  }